

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseBaseUnresolvedName(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  State *in_RDI;
  ParseState copy;
  int *in_stack_00000020;
  State *in_stack_00000028;
  ComplexityGuard guard;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffd0;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar4) {
    local_1 = false;
  }
  else {
    uVar5 = ParseSimpleId((State *)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     CONCAT15(in_stack_ffffffffffffffb5,
                                                              CONCAT14(in_stack_ffffffffffffffb4,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                         );
    if ((bool)uVar5) {
      local_1 = true;
    }
    else {
      uVar1 = (in_RDI->parse_state).mangled_idx;
      uVar2 = (in_RDI->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
      uVar6 = ParseTwoCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (((bool)uVar6) &&
         (in_stack_ffffffffffffffb5 = ParseOperatorName(in_stack_00000028,in_stack_00000020),
         (bool)in_stack_ffffffffffffffb5)) {
        in_stack_ffffffffffffffb4 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_);
        in_stack_ffffffffffffffb3 = Optional((bool)in_stack_ffffffffffffffb4);
        if ((bool)in_stack_ffffffffffffffb3) {
          local_1 = true;
          goto LAB_003d20f7;
        }
      }
      (in_RDI->parse_state).mangled_idx = uVar1;
      (in_RDI->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
      uVar7 = ParseTwoCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (((bool)uVar7) &&
         ((bVar4 = ParseUnresolvedType((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,
                                                           CONCAT13(in_stack_ffffffffffffffb3,
                                                                    CONCAT12(uVar7,CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0)))))))), bVar4 ||
          (bVar4 = ParseSimpleId((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,
                                                           CONCAT13(in_stack_ffffffffffffffb3,
                                                                    CONCAT12(uVar7,CONCAT11(bVar4,
                                                  in_stack_ffffffffffffffb0)))))))), bVar4)))) {
        local_1 = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
        local_1 = false;
      }
    }
  }
LAB_003d20f7:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseBaseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  if (ParseSimpleId(state)) {
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "on") && ParseOperatorName(state, nullptr) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dn") &&
      (ParseUnresolvedType(state) || ParseSimpleId(state))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}